

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

void Gia_ManNameMapVerify
               (Gia_Man_t *p,Gia_Man_t *p1,Gia_Man_t *p2,Vec_Int_t *vMap1,Vec_Int_t *vMap2,int *pMap
               )

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint i;
  uint uVar4;
  int Lit;
  int Lit_00;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar1 = vMap2->nSize;
  Gia_ManSetPhase(p1);
  Gia_ManSetPhase(p2);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
    if (-1 < pMap[uVar10]) {
      i = Abc_Lit2Var(pMap[uVar10]);
      uVar4 = Abc_LitIsCompl(pMap[uVar10]);
      Lit = Vec_IntEntry(vMap1,i);
      Lit_00 = Vec_IntEntry(vMap2,(int)uVar10);
      iVar5 = Abc_Lit2Var(Lit);
      pGVar8 = Gia_ManObj(p1,iVar5);
      if ((-1 < (int)*(uint *)pGVar8 || (~*(uint *)pGVar8 & 0x1fffffff) == 0) &&
         (pGVar8->Value != 0xffffffff)) {
        iVar5 = Abc_Lit2Var(Lit_00);
        pGVar9 = Gia_ManObj(p2,iVar5);
        if (pGVar9->Value != 0xffffffff) {
          uVar6 = Abc_Lit2Var(pGVar8->Value);
          uVar11 = (uint)p->pReprs[uVar6] & 0xfffffff;
          if (uVar11 == 0xfffffff) {
            uVar11 = uVar6;
          }
          uVar7 = Abc_Lit2Var(pGVar9->Value);
          uVar6 = (uint)p->pReprs[uVar7] & 0xfffffff;
          if (uVar6 == 0xfffffff) {
            uVar6 = uVar7;
          }
          if (uVar11 != uVar6) {
            printf("Found functional mismatch for LutId %d and AigId %d.\n",uVar10 & 0xffffffff,
                   (ulong)i);
          }
          uVar2 = *(undefined8 *)pGVar9;
          uVar11 = Abc_LitIsCompl(Lit_00);
          uVar3 = *(undefined8 *)pGVar8;
          uVar6 = Abc_LitIsCompl(Lit);
          if ((uVar11 ^ (uint)((ulong)uVar2 >> 0x3f)) !=
              (uVar6 ^ uVar4 ^ (uint)((ulong)uVar3 >> 0x3f))) {
            printf("Found phase mismatch for LutId %d and AigId %d.\n",uVar10 & 0xffffffff,(ulong)i)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManNameMapVerify( Gia_Man_t * p, Gia_Man_t * p1, Gia_Man_t * p2, Vec_Int_t * vMap1, Vec_Int_t * vMap2, int * pMap )
{
    int iLut, iObj1, iObj2, nSize = Vec_IntSize(vMap2);
    Gia_Obj_t * pObjAig, * pObjLut;
    Gia_ManSetPhase( p1 );
    Gia_ManSetPhase( p2 );
    for ( iLut = 0; iLut < nSize; iLut++ )
        if ( pMap[iLut] >= 0 )
        {
            int iObj   = Abc_Lit2Var( pMap[iLut] );
            int fCompl = Abc_LitIsCompl( pMap[iLut] );
            int iLitAig = Vec_IntEntry( vMap1, iObj );
            int iLitLut = Vec_IntEntry( vMap2, iLut );
            pObjAig = Gia_ManObj( p1, Abc_Lit2Var(iLitAig) );
            if ( Gia_ObjIsCo(pObjAig) )
                continue;
            if ( ~pObjAig->Value == 0 )
                continue;
            pObjLut = Gia_ManObj( p2, Abc_Lit2Var(iLitLut) );
            if ( ~pObjLut->Value == 0 )
                continue;
            iObj1 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjAig->Value));
            iObj2 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjLut->Value));
            if ( iObj1 != iObj2 )
                printf( "Found functional mismatch for LutId %d and AigId %d.\n", iLut, iObj );
            if ( (pObjLut->fPhase ^ Abc_LitIsCompl(iLitLut)) != (pObjAig->fPhase ^ Abc_LitIsCompl(iLitAig) ^ fCompl) )
                printf( "Found phase mismatch for LutId %d and AigId %d.\n", iLut, iObj );
        }
}